

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib557.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int errors;
  char *URL_local;
  
  setlocale(1,"C");
  iVar1 = test_weird_arguments();
  iVar2 = test_unsigned_short_formatting();
  iVar3 = test_signed_short_formatting();
  iVar4 = test_unsigned_int_formatting();
  iVar5 = test_signed_int_formatting();
  iVar6 = test_unsigned_long_formatting();
  iVar7 = test_signed_long_formatting();
  iVar8 = test_curl_off_t_formatting();
  iVar9 = test_string_formatting();
  iVar10 = test_float_formatting();
  if (iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1 == 0) {
    URL_local._4_4_ = 0;
  }
  else {
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int errors = 0;
  (void)URL; /* not used */

#ifdef HAVE_SETLOCALE
  /*
   * The test makes assumptions about the numeric locale (specifically,
   * RADIXCHAR) so set it to a known working (and portable) one.
   */
  setlocale(LC_NUMERIC, "C");
#endif

  errors += test_weird_arguments();

  errors += test_unsigned_short_formatting();

  errors += test_signed_short_formatting();

  errors += test_unsigned_int_formatting();

  errors += test_signed_int_formatting();

  errors += test_unsigned_long_formatting();

  errors += test_signed_long_formatting();

  errors += test_curl_off_t_formatting();

  errors += test_string_formatting();

  errors += test_float_formatting();

  if(errors)
    return TEST_ERR_MAJOR_BAD;
  else
    return 0;
}